

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O1

void nsvg__parseStyle(NSVGparser *p,char *str)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  char name [512];
  char value [512];
  char local_438 [512];
  char local_238 [520];
  
  cVar2 = *str;
  do {
    if (cVar2 == '\0') {
      return;
    }
    cVar2 = *str;
    while ((pcVar6 = str, cVar2 != '\0' &&
           (pvVar4 = memchr(" \t\n\v\f\r",(int)cVar2,7), pvVar4 != (void *)0x0))) {
      cVar2 = str[1];
      str = str + 1;
    }
    for (; (pcVar7 = pcVar6, pcVar8 = pcVar6, *pcVar6 != '\0' && (*pcVar6 != ';'));
        pcVar6 = pcVar6 + 1) {
    }
    while ((str < pcVar7 &&
           ((*pcVar7 == 0x3b ||
            (pvVar4 = memchr(" \t\n\v\f\r",(int)*pcVar7,7), pcVar8 = pcVar7, pvVar4 != (void *)0x0))
           ))) {
      pcVar7 = pcVar7 + -1;
      pcVar8 = str;
    }
    pcVar1 = pcVar8 + 1;
    pcVar5 = str;
    pcVar7 = str;
    pcVar10 = str;
    if (str < pcVar1) {
      do {
        pcVar7 = pcVar5;
        pcVar10 = pcVar5;
        if (*pcVar5 == ':') break;
        pcVar7 = pcVar5 + 1;
        bVar11 = pcVar5 < pcVar8;
        pcVar5 = pcVar7;
        pcVar10 = pcVar7;
      } while (bVar11);
    }
    while ((str < pcVar7 &&
           ((*pcVar7 == 0x3a ||
            (pvVar4 = memchr(" \t\n\v\f\r",(int)*pcVar7,7), pcVar5 = pcVar7, pvVar4 != (void *)0x0))
           ))) {
      pcVar7 = pcVar7 + -1;
      pcVar5 = str;
    }
    iVar9 = ((int)pcVar5 - (int)str) + 1;
    iVar3 = 0x1ff;
    if (iVar9 < 0x1ff) {
      iVar3 = iVar9;
    }
    if (iVar9 != 0) {
      memcpy(local_438,str,(long)iVar3);
    }
    local_438[iVar3] = '\0';
    pcVar7 = pcVar10;
    if (pcVar10 < pcVar1) {
      do {
        if ((*pcVar10 != 0x3a) &&
           (pvVar4 = memchr(" \t\n\v\f\r",(int)*pcVar10,7), pcVar7 = pcVar10, pvVar4 == (void *)0x0)
           ) break;
        pcVar7 = pcVar10 + 1;
        bVar11 = pcVar10 < pcVar8;
        pcVar10 = pcVar7;
      } while (bVar11);
    }
    iVar9 = (int)pcVar1 - (int)pcVar7;
    iVar3 = 0x1ff;
    if (iVar9 < 0x1ff) {
      iVar3 = iVar9;
    }
    if (iVar9 != 0) {
      memcpy(local_238,pcVar7,(long)iVar3);
    }
    local_238[iVar3] = '\0';
    nsvg__parseAttr(p,local_438,local_238);
    str = pcVar6 + (*pcVar6 != '\0');
    cVar2 = *str;
  } while( true );
}

Assistant:

static void nsvg__parseStyle(NSVGparser* p, const char* str)
{
	const char* start;
	const char* end;

	while (*str) {
		// Left Trim
		while(*str && nsvg__isspace(*str)) ++str;
		start = str;
		while(*str && *str != ';') ++str;
		end = str;

		// Right Trim
		while (end > start &&  (*end == ';' || nsvg__isspace(*end))) --end;
		++end;

		nsvg__parseNameValue(p, start, end);
		if (*str) ++str;
	}
}